

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Structure * __thiscall soul::AST::StructDeclaration::getStruct(StructDeclaration *this)

{
  string *psVar1;
  pointer pcVar2;
  Structure *o;
  size_t sVar3;
  Structure *pSVar4;
  Member *pMVar5;
  Member *pMVar6;
  string local_88;
  string local_68;
  Type local_48;
  
  if ((this->structure).object == (Structure *)0x0) {
    pSVar4 = (Structure *)operator_new(0x288);
    psVar1 = (this->super_TypeDeclarationBase).name.name;
    if (psVar1 == (string *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + psVar1->_M_string_length);
    Structure::Structure(pSVar4,&local_68,this);
    (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
    o = (this->structure).object;
    (this->structure).object = pSVar4;
    RefCountedPtr<soul::Structure>::decIfNotNull(o);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    sVar3 = (this->members).numActive;
    if (sVar3 != 0) {
      pMVar6 = (this->members).items;
      pMVar5 = pMVar6 + sVar3;
      do {
        pSVar4 = (this->structure).object;
        if (pSVar4 == (Structure *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x47);
        }
        (*(((pMVar6->type).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_48);
        psVar1 = (pMVar6->name).name;
        if (psVar1 == (string *)0x0) {
          throwInternalCompilerError("isValid()","toString",0x23);
        }
        pcVar2 = (psVar1->_M_dataplus)._M_p;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar2,pcVar2 + psVar1->_M_string_length);
        Structure::addMember(pSVar4,&local_48,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
        pMVar6 = pMVar6 + 1;
      } while (pMVar6 != pMVar5);
    }
  }
  pSVar4 = (this->structure).object;
  if (pSVar4 != (Structure *)0x0) {
    return pSVar4;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x46);
}

Assistant:

Structure& getStruct() const
        {
            if (structure == nullptr)
            {
                structure.reset (new Structure (name.toString(), const_cast<StructDeclaration*> (this)));

                for (auto& m : members)
                    structure->addMember (m.type->resolveAsType(), m.name.toString());
            }

            return *structure;
        }